

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

File * __thiscall
NULLCFile::FileCreate
          (File *__return_storage_ptr__,NULLCFile *this,NULLCArray name,NULLCArray access)

{
  FILE *pFVar1;
  char *local_68;
  NULLCFile *local_58;
  File *ret;
  NULLCArray access_local;
  NULLCArray name_local;
  
  local_68 = (char *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),name.len);
  memset(__return_storage_ptr__,0,0xc);
  __return_storage_ptr__->flag = 1;
  local_58 = this;
  if (this == (NULLCFile *)0x0) {
    local_58 = (NULLCFile *)0x2a5791;
  }
  if (local_68 == (char *)0x0) {
    local_68 = "";
  }
  pFVar1 = fopen((char *)local_58,local_68);
  __return_storage_ptr__->handle = (FILE *)pFVar1;
  if (__return_storage_ptr__->handle == (FILE *)0x0) {
    __return_storage_ptr__->flag = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

File FileCreate(NULLCArray name, NULLCArray access)
	{
		File ret = { 0, 0 };

		ret.flag = FILE_OPENED;
		ret.handle = fopen(name.ptr ? name.ptr : "", access.ptr ? access.ptr : "");

		if(!ret.handle)
			ret.flag = 0;

		return ret;
	}